

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O2

void __thiscall
capnp::SegmentArrayMessageReader::~SegmentArrayMessageReader(SegmentArrayMessageReader *this)

{
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__SegmentArrayMessageReader_00205100;
  if ((this->super_MessageReader).allocatedArena == true) {
    capnp::_::ReaderArena::~ReaderArena((ReaderArena *)(this->super_MessageReader).arenaSpace);
    return;
  }
  return;
}

Assistant:

SegmentArrayMessageReader::~SegmentArrayMessageReader() noexcept(false) {}